

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# derivatives.cpp
# Opt level: O3

void lts2::DivergenceWithBackwardScheme(Mat *X1,Mat *X2,Mat *divX)

{
  Mat DX1;
  Mat DX2;
  undefined8 local_250;
  _InputArray local_248 [4];
  Mat local_1e8 [96];
  undefined1 local_188 [16];
  Mat local_178 [96];
  Mat local_118 [96];
  Mat local_b8 [152];
  
  if ((*(long *)(X1 + 0x10) != 0) && (*(long *)(X2 + 0x10) != 0)) {
    local_250 = CONCAT44((int)**(undefined8 **)(X1 + 0x40),
                         (int)((ulong)**(undefined8 **)(X1 + 0x40) >> 0x20));
    cv::Mat::create(divX,&local_250,5);
    local_248[0].obj = local_188;
    local_178[0] = (Mat)0x0;
    local_178[1] = (Mat)0x0;
    local_178[2] = (Mat)0x0;
    local_178[3] = (Mat)0x0;
    local_178[4] = (Mat)0x0;
    local_178[5] = (Mat)0x0;
    local_178[6] = (Mat)0x0;
    local_178[7] = (Mat)0x0;
    local_178[8] = (Mat)0x0;
    local_178[9] = (Mat)0x0;
    local_178[10] = (Mat)0x0;
    local_178[0xb] = (Mat)0x0;
    local_178[0xc] = (Mat)0x0;
    local_178[0xd] = (Mat)0x0;
    local_178[0xe] = (Mat)0x0;
    local_178[0xf] = (Mat)0x0;
    local_188 = (undefined1  [16])0x0;
    local_248[0].flags = -0x3efdfffa;
    local_248[0].sz = (Size)&DAT_400000001;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)divX,local_248);
    cv::Mat::Mat((Mat *)local_248);
    HorizontalGradientWithBackwardScheme(X1,(Mat *)local_248);
    cv::Mat::Mat(local_1e8);
    VerticalGradientWithBackwardScheme(X2,local_1e8);
    cv::operator+((Mat *)local_188,(Mat *)local_248);
    (**(code **)(*(long *)local_188._0_8_ + 0x18))(local_188._0_8_,local_188,divX,0xffffffff);
    cv::Mat::~Mat(local_b8);
    cv::Mat::~Mat(local_118);
    cv::Mat::~Mat(local_178);
    cv::Mat::~Mat(local_1e8);
    cv::Mat::~Mat((Mat *)local_248);
  }
  return;
}

Assistant:

void lts2::DivergenceWithBackwardScheme(const Mat& X1, const Mat& X2, Mat& divX)
{	
    if (!X1.data || !X2.data)
        return;
    
	divX.create(X1.size(), CV_32F);
	divX.setTo(cv::Scalar::all(0));
    
	cv::Mat DX1;
    lts2::HorizontalGradientWithBackwardScheme(X1, DX1);
	
	cv::Mat DX2;
    lts2::VerticalGradientWithBackwardScheme(X2, DX2);
	
	divX = DX1 + DX2;
}